

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fNegativeShaderDirectiveTests.cpp
# Opt level: O3

void deqp::gles31::Functional::NegativeTestShared::anon_unknown_0::accessing_bounding_box_type
               (NegativeTestContext *ctx)

{
  uint uVar1;
  _Alloc_hider _Var2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  string local_58;
  string local_38;
  
  uVar1 = (*ctx->m_renderCtx->_vptr_RenderContext[2])();
  if ((uVar1 & 0xf) == 3) {
    uVar1 = (*ctx->m_renderCtx->_vptr_RenderContext[2])();
    if ((uVar1 & 0xf0) == 0x10) {
      paVar3 = &local_38.field_2;
      local_38._M_dataplus._M_p = (pointer)paVar3;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_38,"gl_BoundingBoxEXT","");
      executeAccessingBoundingBoxType(ctx,&local_38,GLSL_VERSION_310_ES);
      _Var2._M_p = local_38._M_dataplus._M_p;
      goto LAB_0161b958;
    }
  }
  paVar3 = &local_58.field_2;
  local_58._M_dataplus._M_p = (pointer)paVar3;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"gl_BoundingBox","");
  executeAccessingBoundingBoxType(ctx,&local_58,GLSL_VERSION_320_ES);
  _Var2._M_p = local_58._M_dataplus._M_p;
LAB_0161b958:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)_Var2._M_p != paVar3) {
    operator_delete(_Var2._M_p,paVar3->_M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void accessing_bounding_box_type (NegativeTestContext& ctx)
{
	// Extension requirements and name differences depending on the context
	if ((ctx.getRenderContext().getType().getMajorVersion() == 3) && (ctx.getRenderContext().getType().getMinorVersion() == 1))
	{
		executeAccessingBoundingBoxType(ctx, "gl_BoundingBoxEXT", glu::GLSL_VERSION_310_ES);
	}
	else
	{
		executeAccessingBoundingBoxType(ctx, "gl_BoundingBox", glu::GLSL_VERSION_320_ES);
	}

}